

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O0

void __thiscall PInt::WriteValue(PInt *this,FArchive *ar,void *addr)

{
  ulong val_00;
  bool local_42;
  byte local_41;
  QWORD QStack_40;
  BYTE out [2];
  SQWORD qval_1;
  int val_1;
  QWORD qval;
  uint val;
  BYTE bval;
  void *addr_local;
  FArchive *ar_local;
  PInt *this_local;
  
  if (*(int *)&this->field_0x24 == 1) {
    qval._7_1_ = *addr;
    goto LAB_005ad100;
  }
  if ((this->Unsigned & 1U) == 0) {
    if (*(int *)&this->field_0x24 == 8) {
      QStack_40 = *addr;
      if (((long)QStack_40 < -0x80000000) || (0x7fffffff < (long)QStack_40)) {
        FArchive::WriteByte(ar,'\x06');
        FArchive::WriteInt64(ar,QStack_40);
        return;
      }
      qval_1._4_4_ = (DWORD)QStack_40;
LAB_005ad08c:
      if (((int)qval_1._4_4_ < -0x8000) || (0x7fff < (int)qval_1._4_4_)) {
        FArchive::WriteByte(ar,'\x04');
        FArchive::WriteInt32(ar,qval_1._4_4_);
        return;
      }
    }
    else {
      if (*(int *)&this->field_0x24 == 4) {
        qval_1._4_4_ = *addr;
        goto LAB_005ad08c;
      }
      qval_1._4_4_ = (DWORD)*addr;
    }
    if (((int)qval_1._4_4_ < -0x80) || (0x7f < (int)qval_1._4_4_)) {
      FArchive::WriteByte(ar,'\x02');
      FArchive::WriteInt16(ar,(WORD)qval_1._4_4_);
      return;
    }
    qval._7_1_ = (byte)qval_1._4_4_;
    goto LAB_005ad100;
  }
  if (*(int *)&this->field_0x24 == 8) {
    val_00 = *addr;
    if ((val_00 & 0xffffffff00000000) != 0) {
      FArchive::WriteByte(ar,'\a');
      FArchive::WriteInt64(ar,val_00);
      return;
    }
    qval._0_4_ = (uint)val_00;
LAB_005acfb3:
    if (((uint)qval & 0xffff0000) != 0) {
      FArchive::WriteByte(ar,'\x05');
      FArchive::WriteInt32(ar,(uint)qval);
      return;
    }
  }
  else {
    if (*(int *)&this->field_0x24 == 4) {
      qval._0_4_ = *addr;
      goto LAB_005acfb3;
    }
    qval._0_4_ = (uint)*addr;
  }
  if (((uint)qval & 0xffffff00) != 0) {
    FArchive::WriteByte(ar,'\x03');
    FArchive::WriteInt16(ar,(WORD)(uint)qval);
    return;
  }
  qval._7_1_ = (byte)(uint)qval;
LAB_005ad100:
  if ((qval._7_1_ & 0xfe) == 0) {
    FArchive::WriteByte(ar,qval._7_1_ + 8);
  }
  else {
    local_42 = (this->Unsigned & 1U) != 0;
    local_41 = qval._7_1_;
    (*ar->_vptr_FArchive[2])(ar,&local_42,2);
  }
  return;
}

Assistant:

void PInt::WriteValue(FArchive &ar, const void *addr) const
{
	BYTE bval;

	// The process for bytes is the same whether signed or unsigned, since
	// they can't be compacted into a representation with fewer bytes.
	if (Size == 1)
	{
		bval = *(BYTE *)addr;
	}
	else if (Unsigned)
	{
		unsigned val;
		if (Size == 8)
		{
			QWORD qval = *(QWORD *)addr;
			if (qval & 0xFFFFFFFF00000000llu)
			{ // Value needs 64 bits
				ar.WriteByte(VAL_UInt64);
				ar.WriteInt64(qval);
				return;
			}
			// Value can fit in 32 bits or less
			val = (unsigned)qval;
			goto check_u32;
		}
		else if (Size == 4)
		{
			val = *(DWORD *)addr;
check_u32:	if (val & 0xFFFF0000u)
			{ // Value needs 32 bits
				ar.WriteByte(VAL_UInt32);
				ar.WriteInt32(val);
				return;
			}
			// Value can fit in 16 bits or less
			goto check_u16;
		}
		else// if (Size == 2)
		{
			val = *(WORD *)addr;
check_u16:	if (val & 0xFFFFFF00u)
			{ // Value needs 16 bits
				ar.WriteByte(VAL_UInt16);
				ar.WriteInt16(val);
				return;
			}
			// Value can fit in 8 bits
			bval = (BYTE)val;
		}
	}
	else // Signed
	{
		int val;
		if (Size == 8)
		{
			SQWORD qval = *(SQWORD *)addr;
			INT_MIN;
			if (qval < (-0x7FFFFFFF - 1) || qval > 0x7FFFFFFF)
			{ // Value needs 64 bits
				ar.WriteByte(VAL_Int64);
				ar.WriteInt64(qval);
				return;
			}
			// Value can fit in 32 bits or less
			val = (int)qval;
			goto check_s32;
		}
		else if (Size == 4)
		{
			val = *(SDWORD *)addr;
check_s32:	if (val < -0x8000 || val > 0x7FFF)
			{ // Value needs 32 bits
				ar.WriteByte(VAL_Int32);
				ar.WriteInt32(val);
				return;
			}
			// Value can fit in 16 bits or less
			goto check_s16;
		}
		else// if (Size == 2)
		{
			val = *(SWORD *)addr;
check_s16:	if (val < -0x80 || val > 0x7F)
			{ // Value needs 16 bits
				ar.WriteByte(VAL_Int16);
				ar.WriteInt16(val);
				return;
			}
			// Value can fit in 8 bits
			bval = (BYTE)val;
		}
	}
	// If we get here, the value fits in a byte. Values of 0 and 1 are
	// optimized away into the tag so they don't require any extra space
	// to store.
	if (bval & 0xFE)
	{
		BYTE out[2] = { Unsigned ? VAL_UInt8 : VAL_Int8, bval };
		ar.Write(out, 2);
	}
	else
	{
		ar.WriteByte(VAL_Zero + bval);
	}
}